

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

bool __thiscall
QAbstractItemViewPrivate::dropOn
          (QAbstractItemViewPrivate *this,QDropEvent *event,int *dropRow,int *dropCol,
          QModelIndex *dropIndex)

{
  long *plVar1;
  QWidgetData *pQVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined4 uVar6;
  char cVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  DropIndicatorPosition DVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long in_FS_OFFSET;
  double dVar15;
  double dVar16;
  QModelIndex local_78;
  undefined8 local_60;
  undefined1 local_58 [8];
  quintptr qStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_48;
  long local_38;
  
  auVar4._8_8_ = local_78.i;
  auVar4._0_8_ = local_78._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (event[0xc] == (QDropEvent)0x0) {
    plVar1 = *(long **)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                        super_QWidgetPrivate.field_0x8;
    local_58 = (undefined1  [8])0xffffffffffffffff;
    qStack_50 = 0;
    tStack_48.ptr = (QAbstractItemModel *)0x0;
    pQVar2 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
    local_78.i = CONCAT44((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i,
                          (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i);
    local_78.r = 0;
    local_78.c = 0;
    dVar16 = (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(event + 0x10);
    bVar8 = 2147483647.0 < dVar16;
    if (dVar16 <= -2147483648.0) {
      dVar16 = -2147483648.0;
    }
    dVar15 = (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(event + 0x18);
    bVar9 = 2147483647.0 < dVar15;
    if (dVar15 <= -2147483648.0) {
      dVar15 = -2147483648.0;
    }
    local_60 = CONCAT44((int)(double)(-(ulong)bVar9 & 0x41dfffffffc00000 |
                                     ~-(ulong)bVar9 & (ulong)dVar15),
                        (int)(double)(-(ulong)bVar8 & 0x41dfffffffc00000 |
                                     ~-(ulong)bVar8 & (ulong)dVar16));
    cVar7 = QRect::contains((QPoint *)&local_78,SUB81(&local_60,0));
    if (cVar7 != '\0') {
      dVar16 = (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000)
               + *(double *)(event + 0x10);
      bVar8 = 2147483647.0 < dVar16;
      if (dVar16 <= -2147483648.0) {
        dVar16 = -2147483648.0;
      }
      dVar15 = (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000)
               + *(double *)(event + 0x18);
      bVar9 = 2147483647.0 < dVar15;
      if (dVar15 <= -2147483648.0) {
        dVar15 = -2147483648.0;
      }
      local_78._0_8_ =
           CONCAT44((int)(double)(-(ulong)bVar9 & 0x41dfffffffc00000 |
                                 ~-(ulong)bVar9 & (ulong)dVar15),
                    (int)(double)(-(ulong)bVar8 & 0x41dfffffffc00000 |
                                 ~-(ulong)bVar8 & (ulong)dVar16));
      (**(code **)(*plVar1 + 0x1f0))(local_58,plVar1);
      if ((((int)local_58._0_4_ < 0) || ((long)local_58 < 0)) ||
         (tStack_48.ptr == (QAbstractItemModel *)0x0)) {
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,&this->root);
        tStack_48.ptr = local_78.m.ptr;
        local_58._0_4_ = local_78.r;
        local_58._4_4_ = local_78.c;
        qStack_50 = local_78.i;
      }
    }
    uVar10 = (**(code **)(*(long *)this->model + 0xe8))();
    auVar4._8_8_ = local_78.i;
    auVar4._0_4_ = local_78.r;
    auVar4._4_4_ = local_78.c;
    if ((*(uint *)(event + 0x2c) & uVar10) != 0) {
      cVar7 = comparesEqual(&this->root,(QModelIndex *)local_58);
      auVar3._8_8_ = local_78.i;
      auVar3._0_4_ = local_78.r;
      auVar3._4_4_ = local_78.c;
      if (cVar7 == '\0') {
        dVar16 = (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000
                         ) + *(double *)(event + 0x10);
        bVar8 = 2147483647.0 < dVar16;
        if (dVar16 <= -2147483648.0) {
          dVar16 = -2147483648.0;
        }
        dVar15 = (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000
                         ) + *(double *)(event + 0x18);
        bVar9 = 2147483647.0 < dVar15;
        if (dVar15 <= -2147483648.0) {
          dVar15 = -2147483648.0;
        }
        local_60 = CONCAT44((int)(double)(-(ulong)bVar9 & 0x41dfffffffc00000 |
                                         ~-(ulong)bVar9 & (ulong)dVar15),
                            (int)(double)(-(ulong)bVar8 & 0x41dfffffffc00000 |
                                         ~-(ulong)bVar8 & (ulong)dVar16));
        local_78._0_16_ = (**(code **)(*plVar1 + 0x1e0))(plVar1,local_58);
        DVar11 = (**(code **)(*(long *)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate
                                        .super_QWidgetPrivate + 0x120))
                           (this,&local_60,&local_78,local_58);
        auVar5._8_8_ = qStack_50;
        auVar5._0_8_ = local_58;
        this->dropIndicatorPosition = DVar11;
        iVar12 = local_58._0_4_;
        uVar6 = local_58._4_4_;
        if (DVar11 == BelowItem) {
          if (tStack_48.ptr == (QAbstractItemModel *)0x0) {
            local_78._0_16_ = ZEXT816(0xffffffffffffffff);
            local_78.m.ptr = (QAbstractItemModel *)0x0;
          }
          else {
            (**(code **)(*(long *)tStack_48.ptr + 0x68))(&local_78,tStack_48.ptr,local_58);
          }
          iVar12 = iVar12 + 1;
        }
        else {
          iVar13 = -1;
          iVar14 = -1;
          _local_58 = auVar5;
          if (DVar11 != AboveItem) goto LAB_00534e07;
          if (tStack_48.ptr == (QAbstractItemModel *)0x0) {
            local_78._0_16_ = ZEXT816(0xffffffffffffffff);
            local_78.m.ptr = (QAbstractItemModel *)0x0;
          }
          else {
            (**(code **)(*(long *)tStack_48.ptr + 0x68))(&local_78,tStack_48.ptr,local_58);
          }
        }
        tStack_48.ptr = local_78.m.ptr;
        iVar13 = iVar12;
        iVar14 = uVar6;
        _local_58 = (undefined1  [16])local_78._0_16_;
      }
      else {
        this->dropIndicatorPosition = OnViewport;
        iVar13 = -1;
        iVar14 = -1;
        local_78._0_16_ = auVar3;
      }
LAB_00534e07:
      (dropIndex->m).ptr = tStack_48.ptr;
      dropIndex->r = local_58._0_4_;
      dropIndex->c = local_58._4_4_;
      dropIndex->i = local_58._8_8_;
      *dropRow = iVar13;
      *dropCol = iVar14;
      bVar8 = droppingOnItself(this,event,(QModelIndex *)local_58);
      bVar9 = true;
      auVar4 = (undefined1  [16])local_78._0_16_;
      if (!bVar8) goto LAB_00534e3f;
    }
  }
  bVar9 = false;
LAB_00534e3f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar9;
  }
  local_78._0_16_ = auVar4;
  __stack_chk_fail();
}

Assistant:

bool QAbstractItemViewPrivate::dropOn(QDropEvent *event, int *dropRow, int *dropCol, QModelIndex *dropIndex)
{
    Q_Q(QAbstractItemView);
    if (event->isAccepted())
        return false;

    QModelIndex index;
    // rootIndex() (i.e. the viewport) might be a valid index
    if (viewport->rect().contains(event->position().toPoint())) {
        index = q->indexAt(event->position().toPoint());
        if (!index.isValid())
            index = root;
    }

    // If we are allowed to do the drop
    if (model->supportedDropActions() & event->dropAction()) {
        int row = -1;
        int col = -1;
        if (index != root) {
            dropIndicatorPosition = position(event->position().toPoint(), q->visualRect(index), index);
            switch (dropIndicatorPosition) {
            case QAbstractItemView::AboveItem:
                row = index.row();
                col = index.column();
                index = index.parent();
                break;
            case QAbstractItemView::BelowItem:
                row = index.row() + 1;
                col = index.column();
                index = index.parent();
                break;
            case QAbstractItemView::OnItem:
            case QAbstractItemView::OnViewport:
                break;
            }
        } else {
            dropIndicatorPosition = QAbstractItemView::OnViewport;
        }
        *dropIndex = index;
        *dropRow = row;
        *dropCol = col;
        if (!droppingOnItself(event, index))
            return true;
    }
    return false;
}